

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelInternalFormatCase::checkTextureState
          (TextureLevelInternalFormatCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  int level;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  int refValue;
  int queryLevel_1;
  int levelNdx;
  int initialValues [2];
  int queryLevel;
  bool allOk;
  TextureGenerationSpec *spec_local;
  CallLogWrapper *gl_local;
  TextureLevelInternalFormatCase *this_local;
  
  initialValues[1]._3_1_ = 1;
  bVar1 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
          ::empty(&spec->levels);
  if (bVar1) {
    initialValues[0] = 0;
    _queryLevel_1 = 0x822900001908;
    bVar1 = verifyTextureLevelParameterInternalFormatAnyOf
                      (gl,spec->queryTarget,0,0x1003,&queryLevel_1,2,
                       (this->super_TextureLevelCase).m_type);
    initialValues[1]._3_1_ = (initialValues[1]._3_1_ & 1 & bVar1) != 0;
  }
  else {
    for (refValue = 0;
        sVar2 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                ::size(&spec->levels), refValue < (int)sVar2; refValue = refValue + 1) {
      pvVar3 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
               ::operator[](&spec->levels,(long)refValue);
      level = pvVar3->level;
      pvVar3 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
               ::operator[](&spec->levels,(long)refValue);
      bVar1 = verifyTextureLevelParameterInternalFormatEqual
                        (gl,spec->queryTarget,level,0x1003,pvVar3->internalFormat,
                         (this->super_TextureLevelCase).m_type);
      initialValues[1]._3_1_ = (initialValues[1]._3_1_ & 1 & bVar1) != 0;
    }
  }
  return (bool)(initialValues[1]._3_1_ & 1);
}

Assistant:

bool checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
	{
		bool allOk = true;

		if (spec.levels.empty())
		{
			const int queryLevel		= 0;
			const int initialValues[2]	= { GL_RGBA, GL_R8 };

			allOk &= verifyTextureLevelParameterInternalFormatAnyOf(gl, spec.queryTarget, queryLevel, GL_TEXTURE_INTERNAL_FORMAT, initialValues, DE_LENGTH_OF_ARRAY(initialValues), m_type);
		}
		else
		{
			for (int levelNdx = 0; levelNdx < (int)spec.levels.size(); ++levelNdx)
			{
				const int queryLevel	= spec.levels[levelNdx].level;
				const int refValue		= spec.levels[levelNdx].internalFormat;

				allOk &= verifyTextureLevelParameterInternalFormatEqual(gl, spec.queryTarget, queryLevel, GL_TEXTURE_INTERNAL_FORMAT, refValue, m_type);
			}
		}

		return allOk;
	}